

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loader.cpp
# Opt level: O3

string * __thiscall Loader::fileToBinStr(string *__return_storage_ptr__,Loader *this,string *file)

{
  long lVar1;
  uint uVar2;
  void *pvVar3;
  stringstream hexString;
  ifstream binFile;
  stringstream asStack_3b8 [16];
  long local_3a8 [2];
  undefined8 uStack_398;
  uint auStack_390 [22];
  ios_base local_338 [112];
  char acStack_2c8 [152];
  char local_230 [520];
  
  std::ifstream::ifstream(local_230,(string *)file,_S_in);
  std::__cxx11::stringstream::stringstream(asStack_3b8);
  std::istream::seekg((long)local_230,_S_beg);
  uVar2 = std::istream::tellg();
  std::istream::seekg((long)local_230,_S_beg);
  pvVar3 = operator_new__((ulong)uVar2);
  std::istream::read(local_230,(long)pvVar3);
  std::ifstream::close();
  while( true ) {
    uVar2 = uVar2 - 1;
    if ((int)uVar2 < 0) break;
    lVar1 = *(long *)(local_3a8[0] + -0x18);
    if (acStack_2c8[lVar1 + 1] == '\0') {
      std::ios::widen((char)(ostream *)local_3a8 + (char)lVar1);
      acStack_2c8[lVar1 + 1] = '\x01';
    }
    acStack_2c8[lVar1] = '0';
    *(undefined8 *)((long)&uStack_398 + *(long *)(local_3a8[0] + -0x18)) = 2;
    *(uint *)((long)auStack_390 + *(long *)(local_3a8[0] + -0x18)) =
         *(uint *)((long)auStack_390 + *(long *)(local_3a8[0] + -0x18)) & 0xffffffb5 | 8;
    std::ostream::operator<<
              ((ostream *)local_3a8,(uint)*(byte *)((long)pvVar3 + (ulong)(uVar2 & 0x7fffffff)));
  }
  operator_delete(pvVar3,1);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(asStack_3b8);
  std::ios_base::~ios_base(local_338);
  std::ifstream::~ifstream(local_230);
  return __return_storage_ptr__;
}

Assistant:

string Loader::fileToBinStr(string file) {
	ifstream binFile(file);
	stringstream hexString;

	char *buffer;
	binFile.seekg(0, ios::end);
	unsigned int byteCount = binFile.tellg();
	binFile.seekg(0, ios::beg);
	buffer = new char[byteCount];
	binFile.read(buffer, byteCount);
	binFile.close();

	for (int i = byteCount - 1; i >= 0; i--) {
		hexString << setfill('0') << setw(2) << std::hex
				<< (int) ((unsigned char) buffer[i]);
	}

	delete buffer;

	return hexString.str();
}